

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O0

void __thiscall Rml::Property::~Property(Property *this)

{
  Property *this_local;
  
  std::shared_ptr<const_Rml::PropertySource>::~shared_ptr(&this->source);
  Rml::Variant::~Variant(&this->value);
  return;
}

Assistant:

class RMLUICORE_API Property {
public:
	Property();
	template <typename PropertyType>
	Property(PropertyType value, Unit unit, int specificity = -1) : value(value), unit(unit), specificity(specificity)
	{
		definition = nullptr;
		parser_index = -1;
	}
	template <typename EnumType, typename = typename std::enable_if_t<std::is_enum<EnumType>::value, EnumType>>
	Property(EnumType value) : value(static_cast<int>(value)), unit(Unit::KEYWORD), specificity(-1)
	{}

	/// Get the value of the property as a string.
	String ToString() const;

	/// Get the value of the property as a numeric value, if applicable.
	NumericValue GetNumericValue() const;

	/// Templatised accessor.
	template <typename T>
	T Get() const
	{
		return value.Get<T>();
	}

	bool operator==(const Property& other) const { return unit == other.unit && value == other.value; }
	bool operator!=(const Property& other) const { return !(*this == other); }

	Variant value;
	Unit unit;
	int specificity;

	const PropertyDefinition* definition = nullptr;
	int parser_index = -1;

	SharedPtr<const PropertySource> source;
}